

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long lVar7;
  long *plVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  pointer piVar12;
  long lVar13;
  ulong uVar14;
  size_type __n;
  ulong uVar15;
  ulong uVar16;
  size_type sVar17;
  float fVar18;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar13 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    uVar14 = lVar13 >> 3;
    lVar13 = 0;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar13]->type);
      if (iVar9 == 0) {
        uVar16 = lVar13 + 1;
        uVar15 = uVar16;
        if (uVar16 < uVar14) {
          iVar9 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar13]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar10 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar16]->type);
            if (((iVar10 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar16],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 4)) &&
               (uVar15 = uVar16, *piVar4 == iVar9)) break;
            uVar16 = uVar16 + 1;
            uVar15 = uVar14;
          } while (uVar16 < uVar14);
        }
        if (uVar15 != uVar14) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[lVar13];
          pLVar6 = ppLVar5[uVar15];
          fprintf(_stderr,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",
                  (pLVar3->name)._M_dataplus._M_p);
          iVar9 = *(int *)&pLVar6[1]._vptr_Layer;
          __n = (size_type)iVar9;
          fVar1 = *(float *)((long)&pLVar6[1]._vptr_Layer + 4);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_48,__n,(allocator_type *)&local_a8);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_60,__n,(allocator_type *)&local_a8);
          if (0 < iVar9) {
            sVar17 = 0;
            do {
              fVar18 = (float)pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[sVar17] + fVar1;
              if (fVar18 < 0.0) {
                fVar18 = sqrtf(fVar18);
              }
              else {
                fVar18 = SQRT(fVar18);
              }
              lVar7 = *(long *)&pLVar6[1].one_blob_only;
              local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar17] =
                   *(float *)(*(long *)&pLVar6[2].support_tensor_storage + sVar17 * 4) -
                   (*(float *)(lVar7 + sVar17 * 4) *
                   *(float *)(pLVar6[1].name._M_dataplus._M_p + sVar17 * 4)) / fVar18;
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar17] = *(float *)(lVar7 + sVar17 * 4) / fVar18;
              sVar17 = sVar17 + 1;
            } while (__n != sVar17);
          }
          if (*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 0) {
            *(undefined4 *)((long)&pLVar3[1].type._M_string_length + 4) = 1;
            local_a8.cstep = 0;
            local_a8.data = (void *)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            local_a8.allocator = (Allocator *)0x0;
            local_a8.dims = 0;
            local_a8.w = 0;
            ncnn::Mat::create(&local_a8,iVar9,4,(Allocator *)0x0);
            if ((Mat *)&pLVar3[2].support_tensor_storage != &local_a8) {
              piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = *(int **)&pLVar3[2].support_reserved_6;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar8 = (long *)pLVar3[2].type._M_dataplus._M_p;
                  if (plVar8 == (long *)0x0) {
                    if (*(void **)&pLVar3[2].support_tensor_storage != (void *)0x0) {
                      free(*(void **)&pLVar3[2].support_tensor_storage);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              pLVar3[2].name._M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)&pLVar3[2].support_reserved_10 = 0;
              *(undefined8 *)((long)&pLVar3[2].userdata + 4) = 0;
              pLVar3[2].support_tensor_storage = false;
              pLVar3[2].support_reserved_00 = false;
              pLVar3[2].support_reserved_0 = false;
              pLVar3[2].support_reserved_1 = false;
              pLVar3[2].support_reserved_2 = false;
              pLVar3[2].support_reserved_3 = false;
              pLVar3[2].support_reserved_4 = false;
              pLVar3[2].support_reserved_5 = false;
              pLVar3[2].support_reserved_6 = false;
              pLVar3[2].support_reserved_7 = false;
              pLVar3[2].support_reserved_8 = false;
              pLVar3[2].support_reserved_9 = false;
              pLVar3[2].support_reserved_10 = false;
              pLVar3[2].support_reserved_11 = false;
              pLVar3[2].support_reserved_12 = false;
              pLVar3[2].support_reserved_13 = false;
              pLVar3[2].type._M_string_length = 0;
              pLVar3[2].type.field_2._M_allocated_capacity = 0;
              *(undefined4 *)((long)&pLVar3[2].type.field_2 + 8) = 0;
              *(void **)&pLVar3[2].support_tensor_storage = local_a8.data;
              pLVar3[2].support_reserved_6 = (bool)(char)local_a8.refcount._0_4_;
              pLVar3[2].support_reserved_7 = (bool)(char)((uint)local_a8.refcount._0_4_ >> 8);
              pLVar3[2].support_reserved_8 = (bool)(char)((uint)local_a8.refcount._0_4_ >> 0x10);
              pLVar3[2].support_reserved_9 = (bool)(char)((uint)local_a8.refcount._0_4_ >> 0x18);
              pLVar3[2].support_reserved_10 = (bool)(char)local_a8.refcount._4_4_;
              pLVar3[2].support_reserved_11 = (bool)(char)((uint)local_a8.refcount._4_4_ >> 8);
              pLVar3[2].support_reserved_12 = (bool)(char)((uint)local_a8.refcount._4_4_ >> 0x10);
              pLVar3[2].support_reserved_13 = (bool)(char)((uint)local_a8.refcount._4_4_ >> 0x18);
              pLVar3[2].userdata =
                   (void *)CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              pLVar3[2].typeindex = local_a8.elempack;
              pLVar3[2].type._M_dataplus._M_p = (pointer)local_a8.allocator;
              *(int *)&pLVar3[2].type._M_string_length = local_a8.dims;
              *(int *)((long)&pLVar3[2].type._M_string_length + 4) = local_a8.w;
              *(int *)&pLVar3[2].type.field_2 = local_a8.h;
              *(int *)((long)&pLVar3[2].type.field_2 + 4) = local_a8.d;
              *(int *)((long)&pLVar3[2].type.field_2 + 8) = local_a8.c;
              pLVar3[2].name._M_dataplus._M_p = (pointer)local_a8.cstep;
            }
            piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_a8.allocator == (Allocator *)0x0) {
                  if (local_a8.data != (void *)0x0) {
                    free(local_a8.data);
                  }
                }
                else {
                  (*(local_a8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_a8.cstep = 0;
            local_a8.data = (void *)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.dims = 0;
            local_a8.w = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            uVar11 = *(int *)((long)&pLVar3[2].type.field_2 + 8) *
                     *(int *)&pLVar3[2].name._M_dataplus._M_p;
            if (0 < (int)uVar11) {
              memset(*(void **)&pLVar3[2].support_tensor_storage,0,(ulong)uVar11 << 2);
            }
          }
          uVar16 = (long)*(int *)&pLVar3[1].type.field_2 / (long)iVar9;
          if (0 < iVar9) {
            piVar12 = pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            lVar7 = *(long *)&pLVar3[2].support_tensor_storage;
            iVar9 = (int)uVar16;
            sVar17 = 0;
            do {
              if (0 < iVar9) {
                uVar15 = 0;
                do {
                  piVar12[uVar15] =
                       (int)(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[sVar17] * (float)piVar12[uVar15]);
                  uVar15 = uVar15 + 1;
                } while ((uVar16 & 0xffffffff) != uVar15);
              }
              *(float *)(lVar7 + sVar17 * 4) =
                   *(float *)(lVar7 + sVar17 * 4) *
                   local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar17] +
                   local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar17];
              sVar17 = sVar17 + 1;
              piVar12 = piVar12 + iVar9;
            } while (sVar17 != __n);
          }
          if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          iVar9 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar9;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar9].producer = (int)lVar13;
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar6->type,0,(char *)(pLVar6->type)._M_string_length,0x55a19a);
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != uVar14 + (uVar14 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}